

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_close.c
# Opt level: O3

int real_close_for_test(int fd)

{
  char *__s;
  int iVar1;
  long lVar2;
  char *pcVar3;
  code *pcVar4;
  char *__s1;
  Link_map *link_map;
  long local_30;
  
  lVar2 = dlopen(0,2);
  if ((lVar2 != 0) && (iVar1 = dlinfo(lVar2,2,&local_30), lVar2 = local_30, -1 < iVar1)) {
    for (; local_30 = lVar2, lVar2 != 0; lVar2 = *(long *)(lVar2 + 0x18)) {
      __s = *(char **)(lVar2 + 8);
      pcVar3 = strrchr(__s,0x2f);
      __s1 = pcVar3 + 1;
      if (pcVar3 == (char *)0x0) {
        __s1 = __s;
      }
      iVar1 = strncmp(__s1,"libc.so",7);
      if (iVar1 == 0) {
        lVar2 = dlopen(__s1,1);
        if ((lVar2 != 0) && (pcVar4 = (code *)dlsym(lVar2,"close"), pcVar4 != (code *)0x0)) {
          iVar1 = (*pcVar4)(fd);
          return iVar1;
        }
        break;
      }
    }
  }
  abort();
}

Assistant:

int
real_close_for_test(int fd)
{
#if defined(__APPLE__)
	return close(fd);
#else
	void *libc_handle;

#if defined(__OpenBSD__)
	struct r_debug *r_debug = NULL;
	for (Elf_Dyn *dyn = _DYNAMIC; dyn->d_tag != DT_NULL; ++dyn) {
		if (dyn->d_tag == DT_DEBUG) {
			r_debug = (struct r_debug *)dyn->d_un.d_ptr;
			break;
		}
	}
	if (!r_debug) {
		abort();
	}
	struct link_map *link_map = r_debug->r_map;
#else
	if ((libc_handle = dlopen(NULL, RTLD_NOW)) == NULL) {
		abort();
	}

#ifdef __linux__
	typedef struct link_map Link_map;
#endif

	Link_map *link_map;
	if (dlinfo(libc_handle, RTLD_DI_LINKMAP, &link_map) < 0) {
		abort();
	}
#endif

	libc_handle = NULL;
	for (; link_map != NULL; link_map = link_map->l_next) {
		char const *libname = strrchr(link_map->l_name, '/');
		libname = libname == NULL ? link_map->l_name : libname + 1;

		if (strncmp(libname, "libc.so", strlen("libc.so")) == 0) {
			libc_handle = dlopen(libname, RTLD_LAZY);
			break;
		}
	}
	if (libc_handle == NULL) {
		abort();
	}

	typeof(close) *real_close = dlsym(libc_handle, "close");
	if (real_close == NULL) {
		abort();
	}

	return real_close(fd);
#endif
}